

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tsgRuleLocalPolynomial.hpp
# Opt level: O3

void TasGrid::RuleLocal::van_matrix<(TasGrid::RuleLocal::erule)2>
               (int max_order,int num_rows,vector<int,_std::allocator<int>_> *pntr,
               vector<int,_std::allocator<int>_> *indx,vector<double,_std::allocator<double>_> *vals
               )

{
  pointer piVar1;
  pointer pdVar2;
  pointer piVar3;
  int iVar4;
  int iVar5;
  int *piVar6;
  double *pdVar7;
  uint uVar8;
  pointer *ppiVar9;
  size_type __n;
  iterator iVar10;
  iterator iVar11;
  long lVar12;
  value_type_conflict3 i;
  vector<double,_std::allocator<double>_> ancestors_vals;
  int local_bc;
  double *local_b8;
  int local_ac;
  vector<int,_std::allocator<int>_> local_a8;
  undefined8 uStack_90;
  undefined8 local_88;
  undefined1 local_80 [8];
  vector<double,_std::allocator<double>_> local_78;
  vector<int,_std::allocator<int>_> *local_58;
  double local_50;
  double *local_48;
  vector<int,std::allocator<int>> *local_40;
  double local_38;
  
  if (num_rows == 0) {
LAB_0019ebf9:
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)((ulong)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start & 0xffffffff00000000);
    ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)indx,&local_a8);
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x3ff0000000000000;
    ::std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)vals,&local_a8,
               &local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_finish);
    ppiVar9 = &local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_finish;
    goto LAB_0019ec49;
  }
  if (num_rows == 1) {
LAB_0019ead9:
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish._4_4_,1);
    ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)indx,&local_a8);
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x3ff0000000000000;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ._0_4_ = 0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
    ._4_4_ = 0x3ff00000;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x3ff0000000000000;
    ::std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)vals,&local_a8,&uStack_90);
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                             super__Vector_impl_data._M_finish._4_4_,3);
    ppiVar9 = (pointer *)
              ((long)&local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish + 4);
  }
  else {
    uVar8 = num_rows - 1;
    if (1 < uVar8) {
      __n = 1;
      iVar4 = num_rows;
      do {
        uVar8 = (int)uVar8 >> 1;
        __n = __n + 1;
        iVar4 = iVar4 + num_rows;
      } while (1 < uVar8);
      if (num_rows != 2) {
        if (num_rows != 1) {
          if (num_rows != 0) {
            piVar1 = (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_finish != piVar1) {
              (indx->super__Vector_base<int,_std::allocator<int>_>)._M_impl.super__Vector_impl_data.
              _M_finish = piVar1;
            }
            local_58 = pntr;
            ::std::vector<int,_std::allocator<int>_>::reserve
                      ((vector<int,_std::allocator<int>_> *)indx,(long)iVar4);
            pdVar2 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            if ((vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish != pdVar2) {
              (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
              super__Vector_impl_data._M_finish = pdVar2;
            }
            ::std::vector<double,_std::allocator<double>_>::reserve
                      ((vector<double,_std::allocator<double>_> *)vals,(long)iVar4);
            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start =
                 (pointer)((ulong)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                  _M_impl.super__Vector_impl_data._M_start._4_4_ << 0x20);
            ::std::vector<int,_std::allocator<int>_>::vector
                      (&local_a8,(long)(num_rows + 1),(value_type_conflict3 *)&local_78,
                       (allocator_type *)&local_b8);
            piVar1 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            piVar3 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_end_of_storage;
            (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_start =
                 local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_start;
            (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish =
                 local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_finish;
            (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_end_of_storage =
                 local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                 super__Vector_impl_data._M_end_of_storage;
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (pointer)0x0;
            if ((piVar1 != (pointer)0x0) &&
               (operator_delete(piVar1,(long)piVar3 - (long)piVar1),
               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_start != (pointer)0x0)) {
              operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_end_of_storage -
                              (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                    super__Vector_impl_data._M_start);
            }
            lVar12 = 0;
            local_40 = (vector<int,std::allocator<int>> *)indx;
            do {
              local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start = (pointer)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>.
                                            _M_impl.super__Vector_impl_data._M_start._4_4_,
                                            *(int *)((long)&DAT_001d1938 + lVar12));
              iVar10._M_current = *(int **)((long)indx + 8);
              if (iVar10._M_current == *(int **)((long)indx + 0x10)) {
                ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                          ((vector<int,std::allocator<int>> *)indx,iVar10,(int *)&local_a8);
                indx = (vector<int,_std::allocator<int>_> *)local_40;
              }
              else {
                *iVar10._M_current = *(int *)((long)&DAT_001d1938 + lVar12);
                *(int **)((long)indx + 8) = iVar10._M_current + 1;
              }
              lVar12 = lVar12 + 4;
            } while (lVar12 != 0x14);
            iVar4 = 5;
            do {
              local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data
              ._M_start = (pointer)0x3ff0000000000000;
              iVar11._M_current =
                   (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                   super__Vector_impl_data._M_finish;
              if (iVar11._M_current ==
                  (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_end_of_storage) {
                std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                          (vals,iVar11,(double *)&local_a8);
              }
              else {
                *iVar11._M_current = 1.0;
                (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                super__Vector_impl_data._M_finish = iVar11._M_current + 1;
              }
              iVar4 = iVar4 + -1;
            } while (iVar4 != 0);
            piVar1 = (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                     super__Vector_impl_data._M_start;
            piVar1[1] = 1;
            piVar1[2] = 3;
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_end_of_storage = (int *)0x0;
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_start = (pointer)0x0;
            local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
            _M_finish = (pointer)0x0;
            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_end_of_storage = (double *)0x0;
            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_start = (double *)0x0;
            local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
            super__Vector_impl_data._M_finish = (double *)0x0;
            ::std::vector<int,_std::allocator<int>_>::reserve(&local_a8,__n);
            ::std::vector<double,_std::allocator<double>_>::reserve(&local_78,__n);
            local_bc = 3;
            if (3 < num_rows) {
              do {
                (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
                super__Vector_impl_data._M_start[local_bc] =
                     (int)((ulong)(*(long *)((long)indx + 8) - *(long *)indx) >> 2);
                local_50 = getNode<(TasGrid::RuleLocal::erule)2>(local_bc);
                if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                       super__Vector_impl_data._M_start;
                }
                if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish !=
                    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_start) {
                  local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                  super__Vector_impl_data._M_finish =
                       local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                       super__Vector_impl_data._M_start;
                }
                iVar5 = local_bc - (local_bc + 1 >> 0x1f);
                iVar4 = local_bc;
                while (local_ac = iVar5 + 1 >> 1, 4 < iVar4) {
                  if (local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                              ((vector<int,std::allocator<int>> *)&local_a8,
                               (iterator)
                               local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                               super__Vector_impl_data._M_finish,&local_ac);
                  }
                  else {
                    *local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                     super__Vector_impl_data._M_finish = local_ac;
                    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  local_b8 = (double *)
                             evalRaw<(TasGrid::RuleLocal::erule)2>(max_order,local_ac,local_50);
                  if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_finish ==
                      local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                      super__Vector_impl_data._M_end_of_storage) {
                    std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                              ((vector<double,_std::allocator<double>_> *)&local_78,
                               (iterator)
                               local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                               super__Vector_impl_data._M_finish,(double *)&local_b8);
                  }
                  else {
                    *local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                     super__Vector_impl_data._M_finish = (double)local_b8;
                    local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                    super__Vector_impl_data._M_finish =
                         local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                         super__Vector_impl_data._M_finish + 1;
                  }
                  iVar5 = local_ac - (local_ac + 1 >> 0x1f);
                  iVar4 = local_ac;
                }
                local_b8 = (double *)((ulong)local_b8 & 0xffffffff00000000);
                iVar10._M_current = *(int **)((long)indx + 8);
                piVar6 = *(int **)((long)indx + 0x10);
                if (iVar10._M_current == piVar6) {
                  ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)indx,iVar10,(int *)&local_b8);
                  iVar10._M_current = *(int **)((long)indx + 8);
                  piVar6 = *(int **)((long)indx + 0x10);
                }
                else {
                  *iVar10._M_current = 0;
                  iVar10._M_current = iVar10._M_current + 1;
                  *(int **)((long)indx + 8) = iVar10._M_current;
                }
                local_b8._0_4_ = 1;
                if (iVar10._M_current == piVar6) {
                  ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)indx,iVar10,(int *)&local_b8);
                  iVar10._M_current = *(int **)((long)indx + 8);
                  piVar6 = *(int **)((long)indx + 0x10);
                }
                else {
                  *iVar10._M_current = 1;
                  iVar10._M_current = iVar10._M_current + 1;
                  *(int **)((long)indx + 8) = iVar10._M_current;
                }
                local_b8 = (double *)CONCAT44(local_b8._4_4_,2);
                if (iVar10._M_current == piVar6) {
                  ::std::vector<int,_std::allocator<int>_>::_M_realloc_insert<int>
                            ((vector<int,_std::allocator<int>_> *)indx,iVar10,(int *)&local_b8);
                  piVar6 = *(int **)((long)indx + 8);
                }
                else {
                  *iVar10._M_current = 2;
                  piVar6 = iVar10._M_current + 1;
                  *(int **)((long)indx + 8) = piVar6;
                }
                local_b8 = (double *)
                           local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                local_48 = (double *)
                           local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_start;
                ::std::vector<int,std::allocator<int>>::
                _M_range_insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<int*,std::vector<int,std::allocator<int>>>>>
                          ((vector<int,std::allocator<int>> *)indx,piVar6,&local_b8,&local_48);
                iVar10._M_current = *(int **)((long)indx + 8);
                if (iVar10._M_current == *(int **)((long)indx + 0x10)) {
                  ::std::vector<int,std::allocator<int>>::_M_realloc_insert<int_const&>
                            ((vector<int,std::allocator<int>> *)indx,iVar10,&local_bc);
                }
                else {
                  *iVar10._M_current = local_bc;
                  *(int **)((long)indx + 8) = iVar10._M_current + 1;
                }
                local_b8 = (double *)0x3ff0000000000000;
                iVar11._M_current =
                     (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                pdVar7 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                         super__Vector_impl_data._M_end_of_storage;
                if (iVar11._M_current == pdVar7) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (vals,iVar11,(double *)&local_b8);
                  iVar11._M_current =
                       (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  pdVar7 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                }
                else {
                  *iVar11._M_current = 1.0;
                  iVar11._M_current = iVar11._M_current + 1;
                  (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar11._M_current;
                }
                local_38 = local_50 * 0.5;
                local_b8 = (double *)((local_50 + -1.0) * local_38);
                if (iVar11._M_current == pdVar7) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (vals,iVar11,(double *)&local_b8);
                  iVar11._M_current =
                       (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                       super__Vector_impl_data._M_finish;
                  pdVar7 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_end_of_storage;
                }
                else {
                  *iVar11._M_current = (double)local_b8;
                  iVar11._M_current = iVar11._M_current + 1;
                  (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar11._M_current;
                }
                local_b8 = (double *)(local_38 * (local_50 + 1.0));
                if (iVar11._M_current == pdVar7) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (vals,iVar11,(double *)&local_b8);
                  pdVar7 = (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                           super__Vector_impl_data._M_finish;
                }
                else {
                  *iVar11._M_current = (double)local_b8;
                  pdVar7 = iVar11._M_current + 1;
                  (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish = pdVar7;
                }
                local_b8 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_finish;
                local_48 = local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                           super__Vector_impl_data._M_start;
                ::std::vector<double,std::allocator<double>>::
                _M_range_insert<std::reverse_iterator<__gnu_cxx::__normal_iterator<double*,std::vector<double,std::allocator<double>>>>>
                          ((vector<double,std::allocator<double>> *)vals,pdVar7,&local_b8,&local_48)
                ;
                local_b8 = (double *)0x3ff0000000000000;
                iVar11._M_current =
                     (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                     super__Vector_impl_data._M_finish;
                if (iVar11._M_current ==
                    (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                    super__Vector_impl_data._M_end_of_storage) {
                  std::vector<double,_std::allocator<double>_>::_M_realloc_insert<double>
                            (vals,iVar11,(double *)&local_b8);
                }
                else {
                  *iVar11._M_current = 1.0;
                  (vals->super__Vector_base<double,_std::allocator<double>_>)._M_impl.
                  super__Vector_impl_data._M_finish = iVar11._M_current + 1;
                }
                local_bc = local_bc + 1;
              } while (local_bc < num_rows);
            }
            (local_58->super__Vector_base<int,_std::allocator<int>_>)._M_impl.
            super__Vector_impl_data._M_finish[-1] =
                 (int)((ulong)(*(long *)((long)indx + 8) - *(long *)indx) >> 2);
            if (local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                super__Vector_impl_data._M_start != (double *)0x0) {
              operator_delete(local_78.super__Vector_base<double,_std::allocator<double>_>._M_impl.
                              super__Vector_impl_data._M_start,
                              (long)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_end_of_storage -
                              (long)local_78.super__Vector_base<double,_std::allocator<double>_>.
                                    _M_impl.super__Vector_impl_data._M_start);
            }
            if ((double *)
                local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                super__Vector_impl_data._M_start == (double *)0x0) {
              return;
            }
            operator_delete(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                            super__Vector_impl_data._M_start,
                            (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_end_of_storage -
                            (long)local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                                  super__Vector_impl_data._M_start);
            return;
          }
          goto LAB_0019ebf9;
        }
        goto LAB_0019ead9;
      }
    }
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x0;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x1;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage =
         (pointer)CONCAT44(local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
                           super__Vector_impl_data._M_end_of_storage._4_4_,2);
    ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
              ((vector<int,std::allocator<int>> *)indx,&local_a8);
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data.
    _M_end_of_storage = (pointer)0x3ff0000000000000;
    uStack_90 = 0x3ff0000000000000;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start
         = (pointer)0x3ff0000000000000;
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x3ff0000000000000;
    local_88 = 0x3ff0000000000000;
    ::std::vector<double,std::allocator<double>>::_M_assign_aux<double_const*>
              ((vector<double,std::allocator<double>> *)vals,&local_a8,local_80);
    local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_finish
         = (pointer)0x500000003;
    ppiVar9 = &local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.
               super__Vector_impl_data._M_end_of_storage;
  }
LAB_0019ec49:
  local_a8.super__Vector_base<int,_std::allocator<int>_>._M_impl.super__Vector_impl_data._M_start =
       (pointer)0x100000000;
  ::std::vector<int,std::allocator<int>>::_M_assign_aux<int_const*>
            ((vector<int,std::allocator<int>> *)pntr,&local_a8,ppiVar9);
  return;
}

Assistant:

void van_matrix(int max_order, int num_rows, std::vector<int> &pntr, std::vector<int> &indx, std::vector<double> &vals) {
        int max_level = getLevel<effrule>(num_rows);

        if (effrule == erule::pwc) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 0, 1};
                    vals = {1.0, 1.0, 1.0};
                    pntr = {0, 1, 3};
                    break;
                case 2:
                    indx = {0, 0, 1, 0, 2};
                    vals = {1.0, 1.0, 1.0, 1.0, 1.0};
                    pntr = {0, 1, 3, 5};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    for(auto i : std::array<int, 5>{0, 0, 1, 0, 2})
                        indx.push_back(i);
                    for(size_t i=0; i<5; i++)
                        vals.push_back(1.0);
                    pntr[1] = 1;
                    pntr[2] = 3;
                    {
                        std::vector<int> ancestors;
                        ancestors.reserve(max_level);
                        for(int r=3; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            int kid = r;
                            int dad = kid / 3;
                            while(dad != 0) {
                                if (dad % 2 == 0) {
                                    if (kid != 3 * dad)
                                        ancestors.push_back(dad);
                                } else {
                                    if (kid != 3 * dad + 2)
                                        ancestors.push_back(dad);
                                }
                                kid = dad;
                                dad = kid / 3;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            for(size_t i=0; i<ancestors.size() + 2; i++)
                                vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::localp) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    vals.push_back(1.0);
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=1; r<num_rows; r++) {
                            double x = getNode<effrule>(r);
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            if (kid < 4) dad--;
                            while(dad != 0) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                                if (kid < 4) dad--;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back(1.0);
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::semilocalp) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 0, 1};
                    vals = {1.0, 1.0, 1.0};
                    pntr = {0, 1, 3};
                    break;
                case 2:
                    indx = {0, 0, 1, 0, 2};
                    vals = {1.0, 1.0, 1.0, 1.0, 1.0};
                    pntr = {0, 1, 3, 5};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    for(auto i : std::array<int, 5>{0, 0, 1, 0, 2})
                        indx.push_back(i);
                    for(int i=0; i<5; i++)
                        vals.push_back(1.0);
                    pntr[1] = 1;
                    pntr[2] = 3;
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=3; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            double x = getNode<effrule>(r);
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            while(dad > 2) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                            }
                            indx.push_back(0);
                            indx.push_back(1);
                            indx.push_back(2);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back(1.0);
                            vals.push_back( evalRaw<effrule>(max_order, 1, x) );
                            vals.push_back( evalRaw<effrule>(max_order, 2, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else if (effrule == erule::localp0) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    vals.push_back(1.0);
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=1; r<num_rows; r++) {
                            double x = getNode<effrule>(r);
                            pntr[r] = static_cast<int>(indx.size());
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid - 1) / 2;
                            while(dad != 0) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid - 1) / 2;
                            }
                            indx.push_back(0);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back( evalRaw<effrule>(max_order, 0, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        } else { // if (effrule == erule::localpb) {
            switch(num_rows) {
                case 0:
                    indx = {0,};
                    vals = {1.0,};
                    pntr = {0, 1};
                    break;
                case 1:
                    indx = {0, 1};
                    vals = {1.0, 1.0};
                    pntr = {0, 1, 2};
                    break;
                default:
                    indx.clear();
                    indx.reserve(num_rows * max_level);
                    vals.clear();
                    vals.reserve(num_rows * max_level);
                    pntr = std::vector<int>(num_rows + 1, 0);
                    indx.push_back(0);
                    indx.push_back(1);
                    vals.push_back(1.0);
                    vals.push_back(1.0);
                    pntr[1] = 1;
                    {
                        std::vector<int> ancestors;
                        std::vector<double> ancestors_vals;
                        ancestors.reserve(max_level);
                        ancestors_vals.reserve(max_level);
                        for(int r=2; r<num_rows; r++) {
                            pntr[r] = static_cast<int>(indx.size());
                            double x = getNode<effrule>(r);
                            ancestors.clear();
                            ancestors_vals.clear();
                            int kid = r;
                            int dad = (kid + 1) / 2;
                            while(dad > 1) {
                                ancestors.push_back(dad);
                                ancestors_vals.push_back( evalRaw<effrule>(max_order, dad, x) );
                                kid = dad;
                                dad = (kid + 1) / 2;
                            }
                            indx.push_back(0);
                            indx.push_back(1);
                            indx.insert(indx.end(), ancestors.rbegin(), ancestors.rend());
                            indx.push_back(r);
                            vals.push_back( evalRaw<effrule>(max_order, 0, x) );
                            vals.push_back( evalRaw<effrule>(max_order, 1, x) );
                            vals.insert(vals.end(), ancestors_vals.rbegin(), ancestors_vals.rend());
                            vals.push_back(1.0);
                        }
                        pntr.back() = static_cast<int>(indx.size());
                    }
                    break;
            };
        }
    }